

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

IntConstOpnd * IR::IntConstOpnd::New(IntConstType value,IRType type,Func *func,bool dontEncode)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  IntConstOpnd *this;
  undefined7 in_register_00000031;
  
  if (8 < (uint)TySize[CONCAT71(in_register_00000031,type) & 0xffffffff]) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x59b,"(TySize[type] <= sizeof(IntConstType))",
                       "TySize[type] <= sizeof(IntConstType)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this = (IntConstOpnd *)new<Memory::JitArenaAllocator>(0x30,func->m_alloc,0x3d6ef4);
  (this->super_Opnd)._vptr_Opnd = (_func_int **)0x0;
  (this->super_Opnd).m_valueType = (anon_union_2_4_ea848c7b_for_ValueType_13)0x0;
  (this->super_Opnd).m_type = TyIllegal;
  (this->super_Opnd).field_0xb = 0;
  (this->super_Opnd).m_kind = OpndKindInvalid;
  (this->super_Opnd).isDeleted = false;
  *(undefined2 *)&(this->super_Opnd).field_0xe = 0;
  (this->super_EncodableOpnd<long>).m_value = 0;
  (this->super_EncodableOpnd<long>).decodedValue = 0;
  (this->super_EncodableOpnd<long>).name = (char16 *)0x0;
  *(undefined8 *)&this->m_dontEncode = 0;
  IntConstOpnd(this);
  (this->super_Opnd).m_type = type;
  (this->super_Opnd).m_kind = OpndKindIntConst;
  this->m_dontEncode = dontEncode;
  SetValue(this,value);
  return this;
}

Assistant:

IntConstOpnd *
IntConstOpnd::New(IntConstType value, IRType type, Func *func, bool dontEncode)
{
    IntConstOpnd * intConstOpnd;

    Assert(TySize[type] <= sizeof(IntConstType));

    intConstOpnd = JitAnew(func->m_alloc, IR::IntConstOpnd);

    intConstOpnd->m_type = type;
    intConstOpnd->m_kind = OpndKindIntConst;
    intConstOpnd->m_dontEncode = dontEncode;
    intConstOpnd->SetValue(value);

    return intConstOpnd;
}